

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModportItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportItemSyntax,slang::parsing::Token&,slang::syntax::AnsiPortListSyntax&>
          (BumpAllocator *this,Token *args,AnsiPortListSyntax *args_1)

{
  Token name;
  ModportItemSyntax *this_00;
  AnsiPortListSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ModportItemSyntax *)allocate(this,0x28,8);
  name.kind = args->kind;
  name._2_1_ = args->field_0x2;
  name.numFlags.raw = (args->numFlags).raw;
  name.rawLen = args->rawLen;
  name.info = args->info;
  slang::syntax::ModportItemSyntax::ModportItemSyntax(this_00,name,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }